

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

result_type __thiscall
math::wide_integer::uniform_int_distribution<2048u,unsigned_int,void,false>::
generate<std::linear_congruential_engine<unsigned_int,48271u,0u,2147483647u>,32>
          (uniform_int_distribution<2048u,unsigned_int,void,false> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator,
          param_type *input_params)

{
  unsigned_fast_type uVar1;
  bool bVar2;
  uint uVar3;
  array<unsigned_int,_64UL> *paVar4;
  iterator puVar5;
  long lVar6;
  bool local_865;
  result_type *result;
  uintwide_t<24U,_unsigned_char,_void,_false> local_748 [85];
  uintwide_t<24U,_unsigned_char,_void,_false> local_648 [85];
  undefined1 local_548 [8];
  result_type range;
  uintwide_t<24U,_unsigned_char,_void,_false> local_448 [85];
  uintwide_t<2048U,_unsigned_int,_void,_false> local_348;
  uintwide_t<24U,_unsigned_char,_void,_false> local_248 [85];
  uintwide_t<2048U,_unsigned_int,_void,_false> local_148;
  undefined1 local_45;
  undefined4 local_44;
  uint8_t next_byte;
  ulong uStack_40;
  uint right_shift_amount;
  unsigned_fast_type j;
  iterator it;
  generator_result_type value;
  uint32_t digits_gtor_ratio;
  uint32_t digits_limb_ratio;
  uint32_t digits_generator_result_type;
  param_type *input_params_local;
  linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator_local;
  uniform_int_distribution<24U,_unsigned_char,_void,_false> *this_local;
  
  input_params_local = input_params;
  input_generator_local = input_generator;
  uintwide_t<2048u,unsigned_int,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
  enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::value)&&(std::
  numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_int>::digits),void>::type__
            (this,'\0',
             (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
              *)0x0);
  digits_gtor_ratio = 0x20;
  value = 4;
  it._4_4_ = 4;
  it._0_4_ = 0;
  paVar4 = (array<unsigned_int,_64UL> *)
           uintwide_t<2048U,_unsigned_int,_void,_false>::representation
                     ((uintwide_t<2048U,_unsigned_int,_void,_false> *)this);
  j = (unsigned_fast_type)detail::array_detail::array<unsigned_int,_64UL>::begin(paVar4);
  uStack_40 = 0;
  while( true ) {
    uVar1 = j;
    paVar4 = (array<unsigned_int,_64UL> *)
             uintwide_t<2048U,_unsigned_int,_void,_false>::representation
                       ((uintwide_t<2048U,_unsigned_int,_void,_false> *)this);
    puVar5 = detail::array_detail::array<unsigned_int,_64UL>::end(paVar4);
    if ((iterator)uVar1 == puVar5) break;
    if ((uStack_40 & 3) == 0) {
      it._0_4_ = std::linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U>::operator()
                           ((linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *)
                            input_params_local);
    }
    lVar6 = (uStack_40 & 3) << 3;
    local_44 = (undefined4)lVar6;
    uVar3 = (result_type)it >> (sbyte)lVar6;
    local_45 = (undefined1)uVar3;
    *(uint *)j = *(uint *)j | (uVar3 & 0xff) << (sbyte)((uStack_40 & 3) << 3);
    uStack_40 = uStack_40 + 1;
    if ((uStack_40 & 3) == 0) {
      j = j + 4;
    }
  }
  uniform_int_distribution<2048U,_unsigned_int,_void,_false>::param_type::get_a
            ((param_type *)&local_148);
  numeric_limits_uintwide_t_base<2048U,_unsigned_int,_void,_false>::min();
  bVar2 = uintwide_t<2048U,_unsigned_int,_void,_false>::operator!=(&local_148,local_248);
  local_865 = true;
  if (!bVar2) {
    uniform_int_distribution<2048U,_unsigned_int,_void,_false>::param_type::get_b
              ((param_type *)&local_348);
    numeric_limits_uintwide_t_base<2048U,_unsigned_int,_void,_false>::max();
    local_865 = uintwide_t<2048U,_unsigned_int,_void,_false>::operator!=(&local_348,local_448);
  }
  if (local_865 != false) {
    uniform_int_distribution<2048U,_unsigned_int,_void,_false>::param_type::get_b
              ((param_type *)local_648);
    uniform_int_distribution<2048U,_unsigned_int,_void,_false>::param_type::get_a
              ((param_type *)local_748);
    wide_integer::operator-((wide_integer *)local_548,local_648,local_748);
    uintwide_t<2048U,_unsigned_int,_void,_false>::operator++
              ((uintwide_t<2048U,_unsigned_int,_void,_false> *)local_548);
    uintwide_t<2048U,_unsigned_int,_void,_false>::operator%=
              ((uintwide_t<2048U,_unsigned_int,_void,_false> *)this,
               (uintwide_t<2048U,_unsigned_int,_void,_false> *)local_548);
    uniform_int_distribution<2048U,_unsigned_int,_void,_false>::param_type::get_a
              ((param_type *)&result);
    uintwide_t<2048U,_unsigned_int,_void,_false>::operator+=
              ((uintwide_t<2048U,_unsigned_int,_void,_false> *)this,
               (uintwide_t<2048U,_unsigned_int,_void,_false> *)&result);
  }
  return (result_type)SUB83(this,0);
}

Assistant:

constexpr auto generate(GeneratorType& input_generator,
                            const param_type& input_params) const -> result_type
    {
      // Generate random numbers r, where a <= r <= b.

      auto result = static_cast<result_type>(static_cast<std::uint8_t>(UINT8_C(0)));

      using local_limb_type = typename result_type::limb_type;

      using generator_result_type = typename GeneratorType::result_type;

      constexpr auto digits_generator_result_type = static_cast<std::uint32_t>(GeneratorResultBits);

      static_assert(static_cast<std::uint32_t>(digits_generator_result_type % static_cast<std::uint32_t>(UINT8_C(8))) == static_cast<std::uint32_t>(UINT8_C(0)),
                    "Error: Generator result type must have a multiple of 8 bits.");

      constexpr auto digits_limb_ratio =
        static_cast<std::uint32_t>(std::numeric_limits<local_limb_type>::digits / static_cast<int>(INT8_C(8)));

      constexpr auto digits_gtor_ratio = static_cast<std::uint32_t>(digits_generator_result_type / static_cast<std::uint32_t>(UINT8_C(8)));

      generator_result_type value = generator_result_type();

      auto it = result.representation().begin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)

      auto j = static_cast<unsigned_fast_type>(UINT8_C(0));

      while(it != result.representation().end()) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(j % static_cast<unsigned_fast_type>(digits_gtor_ratio)) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          value = input_generator();
        }

        const auto right_shift_amount =
          static_cast<unsigned>
          (
              static_cast<unsigned_fast_type>(j % digits_gtor_ratio)
            * static_cast<unsigned_fast_type>(UINT8_C(8))
          );

        const auto next_byte = static_cast<std::uint8_t>(value >> right_shift_amount);

        *it =
          static_cast<typename result_type::limb_type>
          (
            *it | static_cast<local_limb_type>(static_cast<local_limb_type>(next_byte) << static_cast<unsigned>(static_cast<unsigned_fast_type>(j % digits_limb_ratio) * static_cast<unsigned_fast_type>(UINT8_C(8))))
          );

        ++j;

        if(static_cast<unsigned_fast_type>(j % digits_limb_ratio) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          ++it;
        }
      }

      if(   (input_params.get_a() != (std::numeric_limits<result_type>::min)())
         || (input_params.get_b() != (std::numeric_limits<result_type>::max)()))
      {
        // Note that this restricts the range r to:
        //   r = { [input_generator() % ((b - a) + 1)] + a }

        result_type range(input_params.get_b() - input_params.get_a());

        ++range;

        result %= range;
        result += input_params.get_a();
      }

      return result;
    }